

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphIO.cpp
# Opt level: O3

ErrorCode Escape::loadGraphCSR(char *path,CGraph *cg,int undirected)

{
  size_t sVar1;
  EdgeIdx *pEVar2;
  VertexIdx *pVVar3;
  ErrorCode EVar4;
  ulong uVar5;
  EdgeIdx nEdges;
  VertexIdx nVertices;
  ifstream in_file;
  ulong local_238;
  long local_230;
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,path,_S_in|_S_bin);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    std::istream::read((char *)local_228,(long)&local_230);
    std::istream::read((char *)local_228,(long)&local_238);
    cg->nVertices = local_230;
    cg->nEdges = local_238;
    pEVar2 = (EdgeIdx *)operator_new__(-(ulong)(local_230 + 1U >> 0x3d != 0) | local_230 * 8 + 8U);
    cg->offsets = pEVar2;
    uVar5 = 0xffffffffffffffff;
    if (local_238 < 0x2000000000000000) {
      uVar5 = local_238 * 8;
    }
    pVVar3 = (VertexIdx *)operator_new__(uVar5);
    cg->nbors = pVVar3;
    std::istream::read((char *)local_228,(long)pEVar2);
    std::istream::read((char *)local_228,(long)cg->nbors);
    std::ifstream::close();
    EVar4 = ecNone;
    if (*(int *)(abStack_208 + *(long *)(local_228[0] + -0x18)) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error occurred at writing time!",0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      EVar4 = ecNone;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Cannot open file ",0x11);
    if (path == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x109120);
    }
    else {
      sVar1 = strlen(path);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,path,sVar1);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    EVar4 = ecIOError;
  }
  std::ifstream::~ifstream(local_228);
  return EVar4;
}

Assistant:

ErrorCode Escape::loadGraphCSR(const char *path, CGraph &cg, int undirected)
{
    VertexIdx nVertices;
    EdgeIdx nEdges;
    auto in_file = std::ifstream(path, std::ios::in | std::ios::binary);
    if(!in_file) {
        std::cout << "Cannot open file " << path << std::endl;
        return ecIOError;
    }
    in_file.read(reinterpret_cast<char*> (&nVertices), sizeof(nVertices));
    in_file.read(reinterpret_cast<char*>(&nEdges), sizeof(nEdges));

    cg.nVertices = nVertices;
    cg.nEdges = nEdges;

    cg.offsets = new EdgeIdx[cg.nVertices+1];
    cg.nbors = new VertexIdx[cg.nEdges];

    in_file.read(reinterpret_cast<char*>(cg.offsets), (nVertices+1)* sizeof(VertexIdx));
    in_file.read(reinterpret_cast<char*>(cg.nbors), nEdges*sizeof(EdgeIdx));
    in_file.close();
    if(!in_file.good()) {
        std::cout << "Error occurred at writing time!" << std::endl;
    }
    return ecNone;
}